

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O3

void __thiscall embree::FastAllocator::internal_fix_used_blocks(FastAllocator *this)

{
  Block *pBVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    while (this->threadBlocks[lVar2]._M_b._M_p != (__pointer_type)0x0) {
      pBVar1 = (this->threadBlocks[lVar2]._M_b._M_p)->next;
      (this->threadBlocks[lVar2]._M_b._M_p)->next = (this->usedBlocks)._M_b._M_p;
      LOCK();
      (this->usedBlocks)._M_b._M_p = this->threadBlocks[lVar2]._M_b._M_p;
      UNLOCK();
      LOCK();
      this->threadBlocks[lVar2]._M_b._M_p = pBVar1;
      UNLOCK();
    }
    LOCK();
    this->threadBlocks[lVar2]._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return;
}

Assistant:

void internal_fix_used_blocks()
    {
      /* move thread local blocks to global block list */
      for (size_t i = 0; i < MAX_THREAD_USED_BLOCK_SLOTS; i++)
      {
        while (threadBlocks[i].load() != nullptr) {
          Block* nextUsedBlock = threadBlocks[i].load()->next;
          threadBlocks[i].load()->next = usedBlocks.load();
          usedBlocks = threadBlocks[i].load();
          threadBlocks[i] = nextUsedBlock;
        }
        threadBlocks[i] = nullptr;
      }
    }